

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O2

void ggml_compute_forward_sqrt(ggml_compute_params *params,ggml_tensor *dst)

{
  ushort uVar1;
  ggml_type gVar2;
  ggml_type gVar3;
  ggml_tensor *src0;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  void *pvVar13;
  FILE *__stream;
  char cVar14;
  ggml_bf16_t gVar15;
  long lVar16;
  long lVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  char *pcVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  int64_t ir;
  long lVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  pair<long,_long> pVar28;
  pair<long,_long> pVar29;
  undefined8 uStack_90;
  long local_50;
  undefined1 extraout_var [60];
  
  __stream = _stderr;
  src0 = dst->src[0];
  gVar2 = dst->type;
  gVar3 = src0->type;
  if (gVar3 == GGML_TYPE_BF16) {
    if (gVar2 == GGML_TYPE_F32) {
      cVar14 = ggml_is_contiguous_1(src0);
      if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
         (cVar14 = ggml_are_same_shape(src0,dst), cVar14 != '\0')) {
        if (dst->nb[0] != 4) {
LAB_0012d82d:
          pcVar20 = "nb0 == sizeof(dst_t)";
          uStack_90 = 0x55;
          goto LAB_0012d85d;
        }
        if (src0->nb[0] == 2) {
          sVar4 = src0->nb[2];
          sVar5 = src0->nb[3];
          sVar6 = src0->nb[1];
          lVar7 = src0->ne[1];
          lVar22 = src0->ne[2];
          uVar8 = dst->ne[0];
          sVar9 = dst->nb[1];
          sVar10 = dst->nb[2];
          sVar11 = dst->nb[3];
          pVar28 = get_thread_range(params,src0);
          lVar22 = lVar22 * lVar7;
          for (lVar24 = pVar28.first; lVar24 < pVar28.second; lVar24 = lVar24 + 1) {
            lVar16 = lVar24 / lVar22;
            lVar21 = lVar24 % lVar22;
            lVar17 = lVar21 / lVar7;
            lVar21 = lVar21 % lVar7;
            pvVar12 = src0->data;
            pvVar13 = dst->data;
            for (uVar23 = 0; (~((long)uVar8 >> 0x3f) & uVar8) != uVar23; uVar23 = uVar23 + 1) {
              uVar1 = *(ushort *)
                       ((long)pvVar12 +
                       uVar23 * 2 + lVar21 * sVar6 + lVar16 * sVar5 + lVar17 * sVar4);
              fVar25 = (float)((uint)uVar1 << 0x10);
              if (fVar25 < 0.0) {
                fVar25 = sqrtf(fVar25);
              }
              else {
                auVar26 = ZEXT216(uVar1) << 0x10;
                auVar26 = vsqrtss_avx(auVar26,auVar26);
                fVar25 = auVar26._0_4_;
              }
              *(float *)((long)pvVar13 +
                        uVar23 * 4 + lVar21 * sVar9 + lVar16 * sVar11 + lVar17 * sVar10) = fVar25;
            }
          }
          return;
        }
LAB_0012d846:
        pcVar20 = "nb00 == sizeof(src0_t)";
        uStack_90 = 0x56;
        goto LAB_0012d85d;
      }
    }
    else {
      if (gVar2 != GGML_TYPE_BF16) goto LAB_0012d7dc;
      cVar14 = ggml_is_contiguous_1(src0);
      if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
         (cVar14 = ggml_are_same_shape(src0,dst), cVar14 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012d82d;
        if (src0->nb[0] == 2) {
          sVar4 = src0->nb[2];
          sVar5 = src0->nb[3];
          sVar6 = src0->nb[1];
          lVar7 = src0->ne[1];
          lVar22 = src0->ne[2];
          uVar8 = dst->ne[0];
          sVar9 = dst->nb[1];
          sVar10 = dst->nb[2];
          sVar11 = dst->nb[3];
          pVar28 = get_thread_range(params,src0);
          lVar22 = lVar22 * lVar7;
          for (lVar24 = pVar28.first; lVar24 < pVar28.second; lVar24 = lVar24 + 1) {
            lVar16 = lVar24 / lVar22;
            lVar21 = lVar24 % lVar22;
            lVar17 = lVar21 / lVar7;
            lVar21 = lVar21 % lVar7;
            pvVar12 = src0->data;
            pvVar13 = dst->data;
            for (uVar23 = 0; (~((long)uVar8 >> 0x3f) & uVar8) != uVar23; uVar23 = uVar23 + 1) {
              uVar1 = *(ushort *)
                       ((long)pvVar12 +
                       uVar23 * 2 + lVar21 * sVar6 + lVar16 * sVar5 + lVar17 * sVar4);
              fVar25 = (float)((uint)uVar1 << 0x10);
              if (fVar25 < 0.0) {
                fVar25 = sqrtf(fVar25);
              }
              else {
                auVar26 = ZEXT216(uVar1) << 0x10;
                auVar26 = vsqrtss_avx(auVar26,auVar26);
                fVar25 = auVar26._0_4_;
              }
              gVar15 = f32_to_bf16(fVar25);
              *(uint16_t *)
               ((long)pvVar13 + uVar23 * 2 + lVar21 * sVar9 + lVar16 * sVar11 + lVar17 * sVar10) =
                   gVar15.bits;
            }
          }
          return;
        }
        goto LAB_0012d846;
      }
    }
  }
  else if (gVar3 == GGML_TYPE_F16) {
    if (gVar2 == GGML_TYPE_F32) {
      cVar14 = ggml_is_contiguous_1(src0);
      if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
         (cVar14 = ggml_are_same_shape(src0,dst), cVar14 != '\0')) {
        if (dst->nb[0] != 4) goto LAB_0012d82d;
        if (src0->nb[0] == 2) {
          sVar4 = src0->nb[2];
          sVar5 = src0->nb[3];
          sVar6 = src0->nb[1];
          lVar7 = src0->ne[1];
          lVar22 = src0->ne[2];
          uVar8 = dst->ne[0];
          sVar9 = dst->nb[1];
          sVar10 = dst->nb[2];
          sVar11 = dst->nb[3];
          pVar28 = get_thread_range(params,src0);
          lVar22 = lVar22 * lVar7;
          while( true ) {
            local_50 = pVar28.second;
            lVar24 = pVar28.first;
            if (local_50 <= lVar24) break;
            lVar16 = lVar24 / lVar22;
            lVar21 = lVar24 % lVar22;
            lVar17 = lVar21 / lVar7;
            lVar21 = lVar21 % lVar7;
            pvVar12 = src0->data;
            pvVar13 = dst->data;
            for (uVar23 = 0; (~((long)uVar8 >> 0x3f) & uVar8) != uVar23; uVar23 = uVar23 + 1) {
              fVar25 = *(float *)(&ggml_table_f32_f16 +
                                 (ulong)*(ushort *)
                                         ((long)pvVar12 +
                                         uVar23 * 2 +
                                         lVar21 * sVar6 + lVar16 * sVar5 + lVar17 * sVar4) * 4);
              if (fVar25 < 0.0) {
                fVar25 = sqrtf(fVar25);
              }
              else {
                auVar26 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
                fVar25 = auVar26._0_4_;
              }
              *(float *)((long)pvVar13 +
                        uVar23 * 4 + lVar21 * sVar9 + lVar16 * sVar11 + lVar17 * sVar10) = fVar25;
            }
            pVar28.second = local_50;
            pVar28.first = lVar24 + 1;
          }
          return;
        }
        goto LAB_0012d846;
      }
    }
    else {
      if (gVar2 != GGML_TYPE_F16) goto LAB_0012d7dc;
      cVar14 = ggml_is_contiguous_1(src0);
      if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
         (cVar14 = ggml_are_same_shape(src0,dst), cVar14 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012d82d;
        if (src0->nb[0] == 2) {
          sVar4 = src0->nb[2];
          sVar5 = src0->nb[3];
          sVar6 = src0->nb[1];
          lVar7 = src0->ne[1];
          lVar22 = src0->ne[2];
          uVar8 = dst->ne[0];
          pVar29 = get_thread_range(params,src0);
          lVar22 = lVar22 * lVar7;
          while( true ) {
            local_50 = pVar29.second;
            lVar24 = pVar29.first;
            if (local_50 <= lVar24) break;
            lVar16 = lVar24 % lVar22;
            pvVar12 = src0->data;
            for (uVar23 = 0; (~((long)uVar8 >> 0x3f) & uVar8) != uVar23; uVar23 = uVar23 + 1) {
              fVar25 = *(float *)(&ggml_table_f32_f16 +
                                 (ulong)*(ushort *)
                                         ((long)pvVar12 +
                                         uVar23 * 2 +
                                         (lVar16 % lVar7) * sVar6 + (lVar24 / lVar22) * sVar5 +
                                         (lVar16 / lVar7) * sVar4) * 4);
              if (fVar25 < 0.0) {
                auVar27._0_4_ = sqrtf(fVar25);
                auVar27._4_60_ = extraout_var;
                auVar26 = auVar27._0_16_;
              }
              else {
                auVar26 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
              }
              auVar26 = vcvtps2ph_f16c(auVar26,0);
              vpextrw_avx(auVar26,0);
            }
            pVar29.second = local_50;
            pVar29.first = lVar24 + 1;
          }
          return;
        }
        goto LAB_0012d846;
      }
    }
  }
  else {
    if ((gVar3 != GGML_TYPE_F32) || (gVar2 != GGML_TYPE_F32)) {
LAB_0012d7dc:
      uVar18 = ggml_type_name();
      uVar19 = ggml_type_name(src0->type);
      fprintf(__stream,"%s: unsupported types: dst: %s, src0: %s\n","unary_op",uVar18,uVar19);
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                 ,0x78,"fatal error");
    }
    cVar14 = ggml_is_contiguous_1(src0);
    if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
       (cVar14 = ggml_are_same_shape(src0,dst), cVar14 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_0012d82d;
      if (src0->nb[0] == 4) {
        sVar4 = src0->nb[2];
        sVar5 = src0->nb[3];
        sVar6 = src0->nb[1];
        lVar7 = src0->ne[1];
        lVar22 = src0->ne[2];
        uVar8 = dst->ne[0];
        sVar9 = dst->nb[1];
        sVar10 = dst->nb[2];
        sVar11 = dst->nb[3];
        pVar28 = get_thread_range(params,src0);
        lVar22 = lVar22 * lVar7;
        for (lVar24 = pVar28.first; lVar24 < pVar28.second; lVar24 = lVar24 + 1) {
          lVar16 = lVar24 / lVar22;
          lVar21 = lVar24 % lVar22;
          lVar17 = lVar21 / lVar7;
          lVar21 = lVar21 % lVar7;
          pvVar12 = src0->data;
          pvVar13 = dst->data;
          for (uVar23 = 0; (~((long)uVar8 >> 0x3f) & uVar8) != uVar23; uVar23 = uVar23 + 1) {
            fVar25 = *(float *)((long)pvVar12 +
                               uVar23 * 4 + lVar21 * sVar6 + lVar16 * sVar5 + lVar17 * sVar4);
            if (fVar25 < 0.0) {
              fVar25 = sqrtf(fVar25);
            }
            else {
              auVar26 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
              fVar25 = auVar26._0_4_;
            }
            *(float *)((long)pvVar13 +
                      uVar23 * 4 + lVar21 * sVar9 + lVar16 * sVar11 + lVar17 * sVar10) = fVar25;
          }
        }
        return;
      }
      goto LAB_0012d846;
    }
  }
  pcVar20 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uStack_90 = 0x51;
LAB_0012d85d:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
             ,uStack_90,"GGML_ASSERT(%s) failed",pcVar20);
}

Assistant:

void ggml_compute_forward_sqrt(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_sqrt>(params, dst);
}